

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

path * mp::path::temp_directory_path(void)

{
  path *in_RDI;
  char *dir;
  allocator<char> *this;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *local_10;
  
  local_10 = (string *)getenv("TMPDIR");
  if (local_10 == (string *)0x0) {
    local_10 = (string *)0x1edf48;
  }
  this = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  path((path *)this,local_10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

path path::temp_directory_path() {
  const char *dir = std::getenv("TMPDIR");
  if (!dir) {
# ifdef P_tmpdir
    dir = P_tmpdir;
# else
    dir = "/tmp";
# endif
  }
  return path(dir);
}